

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_24(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> local_118;
  shared_ptr<LNode> local_108;
  shared_ptr<LNode> to_expr;
  shared_ptr<LNode> from_expr;
  shared_ptr<LNode> var;
  undefined1 local_bc [36];
  shared_ptr<LNodeData<LNodeF0Stmt>_> r;
  shared_ptr<LNode> stmts;
  
  get_node((LParser *)&var,in_ESI);
  get_node((LParser *)&from_expr,in_ESI);
  get_node((LParser *)&to_expr,in_ESI);
  get_node((LParser *)&stmts,in_ESI);
  local_bc._0_4_ = 0x2b;
  local_108.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_118.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_bc._20_8_ = to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_bc._28_8_ = to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_bc._4_8_ = stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_bc._12_8_ = stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LNodeF0Stmt::LNodeF0Stmt
            ((LNodeF0Stmt *)&stack0xffffffffffffff90,&local_108,&local_118,
             (shared_ptr<LNode> *)(local_bc + 0x14),(shared_ptr<LNode> *)(local_bc + 4));
  std::make_shared<LNodeData<LNodeF0Stmt>,LNodeType,LNodeF0Stmt>
            ((LNodeType *)&r,(LNodeF0Stmt *)local_bc);
  LNodeF0Stmt::~LNodeF0Stmt((LNodeF0Stmt *)&stack0xffffffffffffff90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_bc + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_bc + 0x1c));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeF0Stmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&to_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&from_expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&var.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_24() {
    // F0Stmt : FOR Var EQUAL Expr TO Expr DO Brs Stmts END Brs
    auto var = this->get_node(10);
    auto from_expr = this->get_node(8);
    auto to_expr = this->get_node(6);
    auto stmts = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeF0Stmt>>(
            LNodeType::F0Stmt,
            LNodeF0Stmt(std::move(var), std::move(from_expr), std::move(to_expr), std::move(stmts))
    );
    return r;
}